

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

string * __thiscall
soplex::SPxException::what_abi_cxx11_(string *__return_storage_ptr__,SPxException *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->msg);
  return __return_storage_ptr__;
}

Assistant:

virtual const std::string what() const
   {
      return msg;
   }